

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

bool gguf_write_to_file(gguf_context *ctx,char *fname,bool only_meta)

{
  FILE *__s;
  size_t sVar1;
  bool bVar2;
  vector<signed_char,_std::allocator<signed_char>_> buf;
  vector<signed_char,_std::allocator<signed_char>_> local_38;
  
  __s = (FILE *)ggml_fopen(fname,"wb");
  if (__s == (FILE *)0x0) {
    bVar2 = false;
    fprintf(_stderr,"%s: failed to open file \'%s\' for writing GGUF data\n","gguf_write_to_file",
            fname);
  }
  else {
    local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    gguf_write_to_buf(ctx,&local_38,only_meta);
    sVar1 = fwrite(local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                   super__Vector_impl_data._M_start,1,
                   (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,__s);
    bVar2 = sVar1 == (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                           _M_impl.super__Vector_impl_data._M_start;
    fclose(__s);
    if (local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar2;
}

Assistant:

bool gguf_write_to_file(const struct gguf_context * ctx, const char * fname, bool only_meta) {
    FILE * file = ggml_fopen(fname, "wb");

    if (!file) {
        fprintf(stderr, "%s: failed to open file '%s' for writing GGUF data\n", __func__, fname);
        return false;
    }

    std::vector<int8_t> buf;
    gguf_write_to_buf(ctx, buf, only_meta);
    const bool ok = fwrite(buf.data(), 1, buf.size(), file) == buf.size();
    fclose(file);
    return ok;
}